

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall TPZMatrix<Fad<double>_>::Decompose_Cholesky(TPZMatrix<Fad<double>_> *this)

{
  double dVar1;
  char cVar2;
  int iVar3;
  int extraout_var;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 local_138 [32];
  Fad<double> sum;
  undefined1 local_f0 [32];
  long local_d0;
  long local_c8;
  long local_c0;
  Fad<double> local_b8;
  FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> local_98;
  Fad<double> tmp;
  Fad<double> local_50;
  
  cVar2 = (this->super_TPZBaseMatrix).fDecomposed;
  if ((cVar2 != '\0') && (cVar2 != '\x03')) {
    Error("Decompose_Cholesky <Matrix already Decomposed>",(char *)0x0);
    cVar2 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (cVar2 == '\0') {
    if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
      Error("Decompose_Cholesky <Matrix must be square>",(char *)0x0);
    }
    iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    local_c0 = CONCAT44(extraout_var,iVar3);
    local_d0 = 0;
    if (local_c0 != 0 && -1 < extraout_var) {
      local_d0 = local_c0;
    }
    lVar5 = 0;
    while( true ) {
      if (lVar5 == local_d0) break;
      for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
        sum.val_ = 0.0;
        sum.dx_.num_elts = 0;
        sum.dx_.ptr_to_data = (double *)0x0;
        sum.defaultVal = 0.0;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&tmp,this,lVar5,lVar6);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_b8,this,lVar5,lVar6);
        local_138._0_8_ = &tmp;
        local_138._8_8_ = &local_b8;
        Fad<double>::operator+=(&sum,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_138)
        ;
        Fad<double>::~Fad(&local_b8);
        Fad<double>::~Fad(&tmp);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_b8,this,lVar5,lVar5);
        local_138._0_8_ = &local_b8;
        local_138._8_8_ = &sum;
        Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
                  (&tmp,(FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)local_138);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar5,lVar5,&tmp);
        Fad<double>::~Fad(&tmp);
        Fad<double>::~Fad(&local_b8);
        Fad<double>::~Fad(&sum);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_b8,this,lVar5,lVar5);
      sqrt<double>((FadExpr<FadFuncSqrt<Fad<double>_>_> *)&sum,&local_b8);
      Fad<double>::Fad<FadFuncSqrt<Fad<double>>>(&tmp,(FadExpr<FadFuncSqrt<Fad<double>_>_> *)&sum);
      Fad<double>::~Fad((Fad<double> *)&sum.dx_);
      Fad<double>::~Fad(&local_b8);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(this,lVar5,lVar5,&tmp);
      lVar6 = lVar5 + 1;
      local_c8 = lVar6;
      for (; lVar6 < local_c0; lVar6 = lVar6 + 1) {
        for (lVar4 = 0; lVar5 != lVar4; lVar4 = lVar4 + 1) {
          sum.val_ = 0.0;
          sum.dx_.num_elts = 0;
          sum.dx_.ptr_to_data = (double *)0x0;
          sum.defaultVal = 0.0;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_b8,this,lVar5,lVar4);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (local_138,this,lVar6,lVar4);
          local_f0._0_8_ = &local_b8;
          local_f0._8_8_ = (Fad<double> *)local_138;
          Fad<double>::operator+=
                    (&sum,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_f0);
          Fad<double>::~Fad((Fad<double> *)local_138);
          Fad<double>::~Fad(&local_b8);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (local_138,this,lVar5,lVar6);
          local_f0._8_8_ = &sum;
          local_f0._0_8_ = (Fad<double> *)local_138;
          Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
                    (&local_b8,(FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)local_f0);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar5,lVar6,&local_b8);
          Fad<double>::~Fad(&local_b8);
          Fad<double>::~Fad((Fad<double> *)local_138);
          Fad<double>::~Fad(&sum);
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&sum,this,lVar5,lVar5);
        Fad<double>::Fad(&local_50,&sum);
        dVar1 = ABS(local_50.val_);
        Fad<double>::~Fad(&local_50);
        if (dVar1 < 1e-12) {
          Error("Decompose_Cholesky <Zero on diagonal>",(char *)0x0);
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (local_138,this,lVar5,lVar6);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  ((Fad<double> *)local_f0,this,lVar5,lVar5);
        local_98.fadexpr_.left_ = (Fad<double> *)local_138;
        local_98.fadexpr_.right_ = (Fad<double> *)local_f0;
        Fad<double>::Fad<FadBinaryDiv<Fad<double>,Fad<double>>>(&local_b8,&local_98);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar5,lVar6,&local_b8);
        Fad<double>::~Fad(&local_b8);
        Fad<double>::~Fad((Fad<double> *)local_f0);
        Fad<double>::~Fad((Fad<double> *)local_138);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_b8,this,lVar5,lVar6);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar6,lVar5,&local_b8);
        Fad<double>::~Fad(&local_b8);
        Fad<double>::~Fad(&sum);
      }
      Fad<double>::~Fad(&tmp);
      lVar5 = local_c8;
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky() {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {//diagonal elements
            TVar sum = 0;
            if constexpr (is_complex<TVar>::value){
                sum += GetVal(i,k)*std::conj(GetVal(i,k));
            }else{
                sum += GetVal(i,k)*GetVal(i,k);
            }
            PutVal( i,i,GetVal(i,i)-sum );
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {//off-diagonal elements
            for(int64_t k=0; k<i; k++) {
                TVar sum = 0.;
                if constexpr (is_complex<TVar>::value){
                    sum += GetVal(i,k)*std::conj(GetVal(j,k));
                }else{
                    sum += GetVal(i,k)*GetVal(j,k);
                }
                PutVal( i,j,GetVal(i,j)-sum);
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            if constexpr (is_complex<TVar>::value){
                PutVal(j,i,std::conj(GetVal(i,j)));
            }else{
                PutVal(j,i,GetVal(i,j));
            }
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
	
}